

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLDoc_parse_buffer_DOM_text_as_nodes
              (SXML_CHAR *buffer,SXML_CHAR *name,XMLDoc *doc,int text_as_nodes)

{
  size_t sVar1;
  undefined1 local_88 [4];
  int ret;
  SAX_Callbacks sax;
  DOM_through_SAX dom;
  int text_as_nodes_local;
  XMLDoc *doc_local;
  SXML_CHAR *name_local;
  SXML_CHAR *buffer_local;
  
  if (((doc == (XMLDoc *)0x0) || (buffer == (SXML_CHAR *)0x0)) || (doc->init_value != 0x19770522)) {
    buffer_local._4_4_ = 0;
  }
  else {
    sax.all_event = (_func_int_XMLEvent_XMLNode_ptr_SXML_CHAR_ptr_int_SAX_Data_ptr *)doc;
    SAX_Callbacks_init_DOM((SAX_Callbacks *)local_88);
    sVar1 = strlen(buffer);
    buffer_local._4_4_ =
         XMLDoc_parse_buffer_SAX_len
                   (buffer,(int)sVar1,name,(SAX_Callbacks *)local_88,&sax.all_event);
    if (buffer_local._4_4_ == 0) {
      XMLDoc_free(doc);
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int XMLDoc_parse_buffer_DOM_text_as_nodes(const SXML_CHAR* buffer, const SXML_CHAR* name, XMLDoc* doc, int text_as_nodes)
{
	DOM_through_SAX dom;
	SAX_Callbacks sax;
	int ret;

	if (doc == NULL || buffer == NULL || doc->init_value != XML_INIT_DONE)
		return FALSE;

	dom.doc = doc;
	dom.current = NULL;
	dom.text_as_nodes = text_as_nodes;
	SAX_Callbacks_init_DOM(&sax);

	ret = XMLDoc_parse_buffer_SAX(buffer, name, &sax, &dom);
	if (!ret) {
		XMLDoc_free(doc);
		return ret;
	}

	/* TODO: Check there is no unfinished root nodes */
	return ret;
}